

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball_view.cpp
# Opt level: O0

void __thiscall
lumeview::ArcBallView::mouse_button(ArcBallView *this,int button,int action,int mods)

{
  bool bVar1;
  Camera *this_00;
  tvec2<float,_(glm::precision)0> local_68;
  undefined1 local_60 [20];
  tvec3<float,_(glm::precision)0> local_4c;
  undefined1 local_40 [8];
  vec3 p;
  float z;
  vec2 *cursorPos;
  int mods_local;
  int action_local;
  int button_local;
  ArcBallView *this_local;
  
  WindowEventListener::mouse_button(&this->super_WindowEventListener,button,action,mods);
  if (button == 0) {
    if (action == 0) {
      bVar1 = ArcBall::dragging(&this->m_arcBall);
      if (bVar1) {
        ArcBall::end_drag(&this->m_arcBall);
      }
    }
    else if (action == 1) {
      register0x00001200 =
           (anon_struct_8_2_947311e6_for_anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2_0
            )WindowEventListener::cursor_position(&this->super_WindowEventListener);
      bVar1 = WindowEventListener::was_double_click(&this->super_WindowEventListener,0);
      if (bVar1) {
        ArcBall::end_drag(&this->m_arcBall);
        p.field_0.field_0.y =
             View::depth_at_screen_coord(&this->m_view,(vec2 *)((long)&p.field_0 + 8));
        if (p.field_0.field_0.y < 1.0) {
          glm::tvec3<float,_(glm::precision)0>::tvec3
                    (&local_4c,p.field_0.field_0.z,z,p.field_0.field_0.y);
          local_60._0_12_ = (undefined1  [12])View::unproject(&this->m_view,&local_4c);
          local_40 = (undefined1  [8])local_60._0_8_;
          p.field_0.field_0.x = (float)local_60._8_4_;
          this_00 = View::camera(&this->m_view);
          Camera::set_translation(this_00,(vec3 *)local_40);
        }
      }
      else {
        glm::tvec2<float,_(glm::precision)0>::tvec2(&local_68,p.field_0.field_0.z,z);
        ArcBall::begin_drag(&this->m_arcBall,&local_68);
      }
    }
  }
  return;
}

Assistant:

void ArcBallView::mouse_button (int button, int action, int mods)
{
	base_t::mouse_button (button, action, mods);

	if(button == MouseButton::LEFT){
		switch(action) {
			case MouseButtonAction::DOWN: {
				const glm::vec2& cursorPos = base_t::cursor_position ();
				if (base_t::was_double_click (button)) {
					m_arcBall.end_drag ();
					float z = m_view.depth_at_screen_coord (cursorPos);
					if (z < 1.f) {
						glm::vec3 p = m_view.unproject (glm::vec3(cursorPos.x, cursorPos.y, z));
						m_view.camera().set_translation (p);
					}
				}
				else
					m_arcBall.begin_drag (glm::vec2(cursorPos.x, cursorPos.y));
			} break;

			case MouseButtonAction::UP: {
				if(m_arcBall.dragging ())
					m_arcBall.end_drag ();
			} break;
		}
	}
}